

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O1

void __thiscall
cbt2DarcShape::getAabb(cbt2DarcShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  uint uVar1;
  cbtScalar cVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM22 [64];
  
  fVar20 = this->zthickness * 0.5;
  fVar21 = this->radius;
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar16 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[0]);
  auVar7 = vandps_avx(auVar16,auVar14);
  auVar15 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[1]);
  auVar8 = vandps_avx(auVar15,auVar14);
  auVar17 = ZEXT416((uint)(t->m_basis).m_el[0].m_floats[2]);
  auVar19 = vandps_avx(auVar17,auVar14);
  auVar18 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]);
  auVar9 = vandps_avx(auVar18,auVar14);
  auVar22 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]);
  auVar10 = vandps_avx(auVar22,auVar14);
  auVar23 = ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]);
  auVar11 = vandps_avx(auVar23,auVar14);
  auVar24 = ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]);
  auVar12 = vandps_avx512vl(auVar24,auVar14);
  auVar25 = ZEXT416((uint)(t->m_basis).m_el[2].m_floats[1]);
  auVar13 = vandps_avx512vl(auVar25,auVar14);
  auVar26 = ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]);
  auVar14 = vandps_avx512vl(auVar26,auVar14);
  uVar1 = *(uint *)&(this->super_cbtConvexInternalShape).field_0x44;
  cVar2 = this->y;
  auVar15 = vmulss_avx512f(auVar15,ZEXT416((uint)cVar2));
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416(uVar1),auVar16);
  auVar16 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar16,auVar17);
  auVar17 = vmulss_avx512f(auVar22,ZEXT416((uint)cVar2));
  auVar17 = vfmadd231ss_avx512f(auVar17,ZEXT416(uVar1),auVar18);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar16,auVar23);
  auVar18 = vmulss_avx512f(auVar25,ZEXT416((uint)cVar2));
  auVar18 = vfmadd231ss_avx512f(auVar18,auVar24,ZEXT416(uVar1));
  auVar16 = vfmadd231ss_avx512f(auVar18,auVar16,auVar26);
  fVar3 = auVar15._0_4_ + (t->m_origin).m_floats[0];
  fVar4 = auVar17._0_4_ + (t->m_origin).m_floats[1];
  fVar5 = auVar16._0_4_ + (t->m_origin).m_floats[2];
  auVar15 = ZEXT416((uint)fVar21);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * auVar8._0_4_)),auVar15,auVar7);
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar20),auVar19);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar21)),auVar15,auVar9);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar20),auVar11);
  auVar19 = vmulss_avx512f(auVar15,auVar13);
  auVar19 = vfmadd231ss_avx512f(auVar19,auVar15,auVar12);
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar20),auVar14);
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar21 = fVar20;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar20 = fVar20 + auVar7._0_4_;
  fVar21 = fVar21 + auVar8._0_4_;
  fVar6 = auVar19._0_4_ + 0.0;
  auVar7 = vinsertps_avx(ZEXT416((uint)(fVar3 - fVar20)),ZEXT416((uint)(fVar4 - fVar21)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar5 - fVar6)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar7;
  auVar7 = vinsertps_avx(ZEXT416((uint)(fVar3 + fVar20)),ZEXT416((uint)(fVar4 + fVar21)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar6 + fVar5)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar7;
  return;
}

Assistant:

void cbt2DarcShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
	cbtVector3 halfExtents; 
	halfExtents.setValue((radius), 
						 (radius),
						 (zthickness*0.5f));

	cbtMatrix3x3 abs_b = t.getBasis().absolute();  
	cbtVector3 center = t.getOrigin()+ t.getBasis()*cbtVector3(this->x, this->y, 0);
	cbtVector3 extent = cbtVector3(abs_b[0].dot(halfExtents),
		   abs_b[1].dot(halfExtents),
		  abs_b[2].dot(halfExtents));
	extent += cbtVector3(getMargin(),getMargin(),0);

	aabbMin = center - extent;
	aabbMax = center + extent;

}